

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::StructColumnWriter::BeginWrite(StructColumnWriter *this,ColumnWriterState *state_p)

{
  reference this_00;
  pointer pCVar1;
  reference this_01;
  type pCVar2;
  idx_t child_idx;
  ulong __n;
  
  for (__n = 0; __n < (ulong)((long)(this->child_writers).
                                    super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->child_writers).
                                    super_vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    this_00 = vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
              ::get<true>(&this->child_writers,__n);
    pCVar1 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
             operator->(this_00);
    this_01 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                           *)&state_p[1].definition_levels.
                              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish,__n);
    pCVar2 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
             ::operator*(this_01);
    (*pCVar1->_vptr_ColumnWriter[7])(pCVar1,pCVar2);
  }
  return;
}

Assistant:

void StructColumnWriter::BeginWrite(ColumnWriterState &state_p) {
	auto &state = state_p.Cast<StructColumnWriterState>();
	for (idx_t child_idx = 0; child_idx < child_writers.size(); child_idx++) {
		child_writers[child_idx]->BeginWrite(*state.child_states[child_idx]);
	}
}